

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<2>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<2> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  PointIndex *pPVar1;
  int *piVar2;
  uint32_t uVar3;
  pointer pvVar4;
  void *pvVar5;
  DecodingStatus *pDVar6;
  uint32_t *puVar7;
  uint *puVar8;
  PointAttributeVectorOutputIterator<unsigned_int> *pPVar9;
  bool bVar10;
  uint32_t uVar11;
  pointer puVar12;
  uint32_t uVar13;
  _Elt_pointer pDVar14;
  ulong uVar15;
  pointer puVar16;
  ulong uVar17;
  uint32_t uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  VectorUint32 *levels;
  uint uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar25;
  uint32_t number;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus local_e8;
  uint32_t local_dc;
  uint32_t local_d8;
  DecodingStatus local_d4;
  ulong local_c8;
  uint32_t local_bc;
  PointAttributeVectorOutputIterator<unsigned_int> *local_b8;
  ulong local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
  local_a8;
  ulong local_58;
  RAnsBitDecoder *local_50;
  VectorUint32 *local_48;
  ulong local_40;
  DirectBitDecoder *local_38;
  
  local_d4.num_remaining_points = 0;
  local_dc = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_d4.num_remaining_points,(allocator_type *)&local_e8);
  pvVar4 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar12 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_d4.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_d4.num_remaining_points,(allocator_type *)&local_e8);
  pvVar4 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar12 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_d4.num_remaining_points = local_dc;
  local_d4.last_axis = 0;
  local_d4.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>>
                *)&local_a8,&local_d4);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_d4.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_d4.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_d4.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_50 = &this->numbers_decoder_;
    local_48 = &this->p_;
    local_38 = &this->remaining_bits_decoder_;
    local_b8 = oit;
    do {
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        uVar22 = pDVar6[0x29].num_remaining_points;
        uVar11 = pDVar6[0x29].last_axis;
        uVar20 = pDVar6[0x29].stack_pos;
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        uVar22 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_remaining_points;
        uVar11 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar20 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      uVar19 = (ulong)uVar20;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = pDVar14;
      if (local_dc < uVar22) {
LAB_001582c5:
        bVar10 = false;
        goto LAB_001582c7;
      }
      pvVar25 = (this->base_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar19;
      levels = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar19;
      local_40 = uVar19;
      uVar11 = GetAxis(this,uVar22,levels,uVar11);
      pPVar9 = local_b8;
      uVar17 = (ulong)uVar11;
      if (this->dimension_ <= uVar11) goto LAB_001582c5;
      uVar18 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      local_b0 = uVar19;
      if (this->bit_length_ == uVar18) {
        for (; uVar22 != 0; uVar22 = uVar22 - 1) {
          PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar9,pvVar25);
          pPVar1 = &pPVar9->point_id_;
          pPVar1->value_ = pPVar1->value_ + 1;
          this->num_decoded_points_ = this->num_decoded_points_ + 1;
        }
      }
      else {
        if (2 < uVar22) {
          if (this->num_decoded_points_ <= this->num_points_) {
            uVar19 = (ulong)(uVar20 + 1);
            local_c8 = uVar17;
            local_bc = this->bit_length_;
            local_58 = uVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar19,pvVar25);
            piVar2 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_c8 * 4);
            *piVar2 = *piVar2 + (1 << ((char)local_bc + ~(byte)uVar18 & 0x1f));
            iVar21 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> iVar21 == 0; iVar21 = iVar21 + -1) {
              }
            }
            local_d8 = 0;
            RAnsBitDecoder::DecodeLeastSignificantBits32(local_50,iVar21,&local_d8);
            uVar18 = (uVar22 >> 1) - local_d8;
            if (local_d8 <= uVar22 >> 1) {
              uVar23 = uVar22 - uVar18;
              uVar24 = uVar18;
              if ((uVar18 != uVar23) &&
                 (puVar8 = (this->half_decoder_).pos_._M_current, uVar24 = uVar23,
                 puVar8 != (this->half_decoder_).bits_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                uVar3 = (this->half_decoder_).num_used_bits_;
                uVar22 = *puVar8;
                uVar13 = uVar3 + 1;
                (this->half_decoder_).num_used_bits_ = uVar13;
                if (uVar13 == 0x20) {
                  (this->half_decoder_).pos_._M_current = puVar8 + 1;
                  (this->half_decoder_).num_used_bits_ = 0;
                }
                if ((0x80000000U >> ((byte)uVar3 & 0x1f) & uVar22) != 0) {
                  uVar24 = uVar18;
                  uVar18 = uVar23;
                }
              }
              pvVar4 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar25 = pvVar4 + local_40;
              puVar12 = (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_c8;
              *puVar12 = *puVar12 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (pvVar4 + uVar19,pvVar25);
              if (uVar24 != 0) {
                local_e8.stack_pos = (uint32_t)local_b0;
                local_e8.num_remaining_points = uVar24;
                local_e8.last_axis = uVar11;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              if (uVar18 != 0) {
                local_e8.stack_pos = (uint32_t)local_58;
                local_e8.num_remaining_points = uVar18;
                local_e8.last_axis = uVar11;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              goto LAB_001582b1;
            }
          }
          goto LAB_001582c5;
        }
        puVar7 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *puVar7 = uVar11;
        uVar19 = (ulong)this->dimension_;
        if (1 < this->dimension_) {
          uVar15 = 1;
          do {
            uVar20 = (int)uVar17 + 1;
            if ((int)uVar17 == (int)uVar19 + -1) {
              uVar20 = 0;
            }
            puVar7[uVar15] = uVar20;
            uVar15 = uVar15 + 1;
            uVar19 = (ulong)this->dimension_;
            uVar17 = (ulong)uVar20;
          } while (uVar15 < uVar19);
        }
        if (uVar22 != 0) {
          uVar20 = 0;
          do {
            if (this->dimension_ != 0) {
              puVar12 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar16 = (this->axes_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar19 = 0;
              do {
                puVar12[puVar16[uVar19]] = 0;
                uVar17 = (ulong)puVar16[uVar19];
                iVar21 = this->bit_length_ -
                         (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar17];
                if (iVar21 != 0) {
                  bVar10 = DirectBitDecoder::DecodeLeastSignificantBits32
                                     (local_38,iVar21,puVar12 + uVar17);
                  if (!bVar10) goto LAB_001582c5;
                  puVar12 = (this->p_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  puVar16 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar17 = (ulong)puVar16[uVar19];
                }
                puVar12[uVar17] =
                     puVar12[uVar17] |
                     (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar17];
                uVar19 = uVar19 + 1;
              } while (uVar19 < this->dimension_);
            }
            pPVar9 = local_b8;
            PointAttributeVectorOutputIterator<unsigned_int>::operator=(local_b8,local_48);
            (pPVar9->point_id_).value_ = (pPVar9->point_id_).value_ + 1;
            this->num_decoded_points_ = this->num_decoded_points_ + 1;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar22);
        }
      }
LAB_001582b1:
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar10 = true;
LAB_001582c7:
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<2>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return bVar10;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}